

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * license::toupper_copy(string *__return_storage_ptr__,string *lowercase)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  string *lowercase_local;
  string *cp;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lowercase);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (__first,__last,__result,toupper);
  return __return_storage_ptr__;
}

Assistant:

string toupper_copy(const string& lowercase) {
	string cp(lowercase);
	std::transform(cp.begin(), cp.end(), cp.begin(), (int (*)(int))toupper);
	return cp;
}